

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this)

{
  this->_cached_size_ = 0;
  (this->java_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->java_outer_classname_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->go_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->objc_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->csharp_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->swift_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->java_multiple_files_ = false;
  this->java_generate_equals_and_hash_ = false;
  this->java_string_check_utf8_ = false;
  this->cc_generic_services_ = false;
  this->java_generic_services_ = false;
  this->py_generic_services_ = false;
  this->deprecated_ = false;
  this->cc_enable_arenas_ = false;
  this->optimize_for_ = 1;
  return;
}

Assistant:

void FileOptions::SharedCtor() {
  _cached_size_ = 0;
  java_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  java_outer_classname_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  go_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  objc_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  csharp_namespace_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  swift_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  php_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&java_multiple_files_, 0, reinterpret_cast<char*>(&cc_enable_arenas_) -
    reinterpret_cast<char*>(&java_multiple_files_) + sizeof(cc_enable_arenas_));
  optimize_for_ = 1;
}